

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.cc
# Opt level: O1

void __thiscall SpinLock::SlowLock(SpinLock *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int value;
  
  if (((this->lockword_).super___atomic_base<int>._M_i != 0 & adaptive_spin_count) == 1) {
    iVar3 = 1000;
    if ((adaptive_spin_count & 1) == 0) {
      iVar3 = 0;
    }
    do {
      if ((this->lockword_).super___atomic_base<int>._M_i == 0) break;
      bVar1 = 2 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar1);
  }
  iVar3 = 0;
  do {
    do {
      iVar2 = 0;
      do {
        LOCK();
        value = (this->lockword_).super___atomic_base<int>._M_i;
        if (iVar2 == value) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          value = iVar2;
        }
        UNLOCK();
        if (value != 1) {
          if (value == 0) {
            return;
          }
          goto LAB_0010b0fa;
        }
        LOCK();
        iVar2 = (this->lockword_).super___atomic_base<int>._M_i;
        if (iVar2 == 1) {
          (this->lockword_).super___atomic_base<int>._M_i = 2;
          iVar2 = value;
        }
        UNLOCK();
      } while (iVar2 == 0);
      value = iVar2;
      if (iVar2 == 1) {
        value = 2;
      }
LAB_0010b0fa:
      iVar3 = iVar3 + 1;
      base::internal::SpinLockDelay(&this->lockword_,value,iVar3);
    } while (((this->lockword_).super___atomic_base<int>._M_i != 0 & adaptive_spin_count) != 1);
    iVar2 = 0;
    if ((adaptive_spin_count & 1) != 0) {
      iVar2 = 1000;
    }
    do {
      if ((this->lockword_).super___atomic_base<int>._M_i == 0) break;
      bVar1 = 2 < iVar2;
      iVar2 = iVar2 + -1;
    } while (bVar1);
  } while( true );
}

Assistant:

void SpinLock::SlowLock() {
  int lock_value = SpinLoop();

  int lock_wait_call_count = 0;
  while (lock_value != kSpinLockFree) {
    // If the lock is currently held, but not marked as having a sleeper, mark
    // it as having a sleeper.
    if (lock_value == kSpinLockHeld) {
      // Here, just "mark" that the thread is going to sleep.  Don't
      // store the lock wait time in the lock as that will cause the
      // current lock owner to think it experienced contention. Note,
      // compare_exchange updates lock_value with previous value of
      // lock word.
      lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper,
                                        std::memory_order_acquire);
      if (lock_value == kSpinLockHeld) {
        // Successfully transitioned to kSpinLockSleeper.  Pass
        // kSpinLockSleeper to the SpinLockDelay routine to properly indicate
        // the last lock_value observed.
        lock_value = kSpinLockSleeper;
      } else if (lock_value == kSpinLockFree) {
        // Lock is free again, so try and acquire it before sleeping.  The
        // new lock state will be the number of cycles this thread waited if
        // this thread obtains the lock.
        lockword_.compare_exchange_strong(lock_value, kSpinLockSleeper, std::memory_order_acquire);
        continue;  // skip the delay at the end of the loop
      }
    }

    // Wait for an OS specific delay.
    base::internal::SpinLockDelay(&lockword_, lock_value,
                                  ++lock_wait_call_count);
    // Spin again after returning from the wait routine to give this thread
    // some chance of obtaining the lock.
    lock_value = SpinLoop();
  }
}